

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setAttribute
          (Program *this,Buffer *attrBuf,int attrBufOffset,VarSpec *attrSpec,
          string *shaderNameManglingSuffix)

{
  GLuint GVar1;
  int size;
  socklen_t __len;
  VarSpec *pVVar2;
  sockaddr *__addr;
  string local_48;
  
  GVar1 = this->m_programGL;
  pVVar2 = attrSpec;
  mangleShaderNames(&local_48,&attrSpec->name,shaderNameManglingSuffix);
  __len = (socklen_t)pVVar2;
  GVar1 = glwGetAttribLocation(GVar1,local_48._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_48);
  glwEnableVertexAttribArray(GVar1);
  LongStressCaseInternal::Buffer::bind(attrBuf,0x8892,__addr,__len);
  if (attrSpec->type - TYPE_FLOAT < 4) {
    size = glu::getDataTypeScalarSize(attrSpec->type);
    glwVertexAttribPointer(GVar1,size,0x1406,'\0',0,(void *)(long)attrBufOffset);
  }
  return;
}

Assistant:

void Program::setAttribute (const Buffer& attrBuf, const int attrBufOffset, const VarSpec& attrSpec, const string& shaderNameManglingSuffix) const
{
	const int attrLoc = glGetAttribLocation(m_programGL, mangleShaderNames(attrSpec.name, shaderNameManglingSuffix).c_str());

	glEnableVertexAttribArray(attrLoc);
	attrBuf.bind(GL_ARRAY_BUFFER);

	if (glu::isDataTypeFloatOrVec(attrSpec.type))
		glVertexAttribPointer(attrLoc, glu::getDataTypeScalarSize(attrSpec.type), GL_FLOAT, GL_FALSE, 0, (GLvoid*)(deIntptr)attrBufOffset);
	else
		DE_ASSERT(false);
}